

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O0

int cuddHashTableInsert2(DdHashTable *hash,DdNode *f,DdNode *g,DdNode *value,ptrint count)

{
  int iVar1;
  uint uVar2;
  DdHashItem *pDVar3;
  DdHashItem *item;
  uint posn;
  int result;
  ptrint count_local;
  DdNode *value_local;
  DdNode *g_local;
  DdNode *f_local;
  DdHashTable *hash_local;
  
  if ((hash->maxsize < hash->size) && (iVar1 = cuddHashTableResize(hash), iVar1 == 0)) {
    hash_local._4_4_ = 0;
  }
  else {
    pDVar3 = cuddHashTableAlloc(hash);
    if (pDVar3 == (DdHashItem *)0x0) {
      hash_local._4_4_ = 0;
    }
    else {
      hash->size = hash->size + 1;
      pDVar3->value = value;
      *(int *)(((ulong)value & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)value & 0xfffffffffffffffe) + 4) + 1;
      pDVar3->count = count;
      pDVar3->key[0] = f;
      pDVar3[1].next = (DdHashItem *)g;
      uVar2 = (((uint)(*(long *)(((ulong)f & 0xfffffffffffffffe) + 0x20) << 1) | (uint)f & 1) *
               0xc00005 +
              ((uint)(*(long *)(((ulong)g & 0xfffffffffffffffe) + 0x20) << 1) | (uint)g & 1)) *
              0x40f1f9 >> ((byte)hash->shift & 0x1f);
      pDVar3->next = hash->bucket[uVar2];
      hash->bucket[uVar2] = pDVar3;
      hash_local._4_4_ = 1;
    }
  }
  return hash_local._4_4_;
}

Assistant:

int
cuddHashTableInsert2(
  DdHashTable * hash,
  DdNode * f,
  DdNode * g,
  DdNode * value,
  ptrint count)
{
    int result;
    unsigned int posn;
    DdHashItem *item;

#ifdef DD_DEBUG
    assert(hash->keysize == 2);
#endif

    if (hash->size > hash->maxsize) {
        result = cuddHashTableResize(hash);
        if (result == 0) return(0);
    }
    item = cuddHashTableAlloc(hash);
    if (item == NULL) return(0);
    hash->size++;
    item->value = value;
    cuddRef(value);
    item->count = count;
    item->key[0] = f;
    item->key[1] = g;
    posn = ddLCHash2(cuddF2L(f),cuddF2L(g),hash->shift);
    item->next = hash->bucket[posn];
    hash->bucket[posn] = item;

    return(1);

}